

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::DragBehaviorT<int,int,float>
               (ImGuiDataType data_type,int *v,float v_speed,int v_min,int v_max,char *format,
               float power,ImGuiDragFlags flags)

{
  bool bVar1;
  bool bVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  uint uVar5;
  ImGuiInputSource IVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  bool bVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  ImVec2 local_50;
  undefined1 local_48 [16];
  
  pIVar3 = GImGui;
  uVar5 = data_type & 0xfffffffe;
  bVar10 = uVar5 != 4;
  bVar11 = v_max - v_min != 0;
  bVar1 = power == 1.0;
  if (v_speed == 0.0 && bVar11) {
    v_speed = (float)(v_max - v_min) * GImGui->DragSpeedDefaultRatio;
  }
  uVar8 = flags & 1;
  IVar6 = GImGui->ActiveIdSource;
  if (IVar6 == ImGuiInputSource_Mouse) {
    bVar4 = IsMousePosValid((ImVec2 *)0x0);
    if ((!bVar4) || ((pIVar3->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) {
      IVar6 = pIVar3->ActiveIdSource;
      goto LAB_0014ac20;
    }
    fVar15 = (pIVar3->IO).NavInputs[(ulong)uVar8 + 0x1d];
    if ((pIVar3->IO).KeyAlt != false) {
      fVar15 = fVar15 * 0.01;
    }
    if ((pIVar3->IO).KeyShift == true) {
      fVar15 = fVar15 * 10.0;
    }
  }
  else {
LAB_0014ac20:
    fVar15 = 0.0;
    if (IVar6 == ImGuiInputSource_Nav) {
      iVar9 = 0;
      if (uVar5 == 4) {
        iVar9 = ImParseFormatPrecision(format,3);
      }
      local_50 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      local_48 = ZEXT416(*(uint *)(local_48 + (ulong)uVar8 * 4 + -8));
      fVar15 = GetMinimumStepAtDecimalPrecision(iVar9);
      v_speed = (float)((uint)v_speed & -(uint)(fVar15 <= v_speed) |
                       ~-(uint)(fVar15 <= v_speed) & (uint)fVar15);
      fVar15 = (float)local_48._0_4_;
    }
  }
  fVar15 = fVar15 * v_speed;
  fVar14 = fVar15;
  if (uVar8 != 0) {
    fVar14 = -fVar15;
  }
  iVar9 = v_max - v_min;
  if (iVar9 == 0) {
    bVar4 = false;
  }
  else if ((*v < v_max) || (bVar4 = true, fVar14 <= 0.0)) {
    bVar4 = fVar14 < 0.0 && *v <= v_min;
  }
  if ((bVar10 || !bVar11) || bVar1) {
LAB_0014ad30:
    bVar2 = false;
  }
  else {
    if ((fVar14 < 0.0) && (0.0 < pIVar3->DragCurrentAccum)) goto LAB_0014ad64;
    if (fVar14 <= 0.0) goto LAB_0014ad30;
    bVar2 = pIVar3->DragCurrentAccum <= 0.0 && pIVar3->DragCurrentAccum != 0.0;
  }
  if (((pIVar3->ActiveIdIsJustActivated & 1U) == 0 && !bVar4) && (!bVar2)) {
    if ((fVar15 != 0.0) || (NAN(fVar15))) {
      pIVar3->DragCurrentAccum = pIVar3->DragCurrentAccum + fVar14;
      pIVar3->DragCurrentAccumDirty = true;
    }
    else if ((pIVar3->DragCurrentAccumDirty & 1U) == 0) {
      return false;
    }
    if ((bVar10 || !bVar11) || bVar1) {
      iVar7 = *v + (int)pIVar3->DragCurrentAccum;
      fVar15 = 0.0;
    }
    else {
      fVar15 = powf((float)(*v - v_min) / (float)iVar9,1.0 / power);
      fVar12 = fVar15 + pIVar3->DragCurrentAccum / (float)iVar9;
      fVar13 = 1.0;
      if (fVar12 <= 1.0) {
        fVar13 = fVar12;
      }
      fVar13 = powf((float)(~-(uint)(fVar12 < 0.0) & (uint)fVar13),power);
      iVar7 = (int)fVar13 * iVar9 + v_min;
    }
    iVar7 = RoundScalarWithFormatT<int,int>(format,data_type,iVar7);
    pIVar3->DragCurrentAccumDirty = false;
    if ((bVar10 || !bVar11) || bVar1) {
      iVar9 = *v;
      pIVar3->DragCurrentAccum = pIVar3->DragCurrentAccum - (float)(iVar7 - iVar9);
    }
    else {
      fVar13 = powf((float)(iVar7 - v_min) / (float)iVar9,1.0 / power);
      pIVar3->DragCurrentAccum = pIVar3->DragCurrentAccum - (fVar13 - fVar15);
      iVar9 = *v;
    }
    if ((v_max != v_min) && (iVar9 != iVar7)) {
      if ((iVar7 < v_min) || (((uVar5 != 4 && (iVar9 < iVar7)) && (fVar14 < 0.0)))) {
        iVar7 = v_min;
      }
      if ((v_max < iVar7) || (((uVar5 != 4 && (iVar7 < iVar9)) && (0.0 < fVar14)))) {
        iVar7 = v_max;
      }
    }
    if (iVar9 == iVar7) {
      return false;
    }
    *v = iVar7;
    return true;
  }
LAB_0014ad64:
  pIVar3->DragCurrentAccum = 0.0;
  pIVar3->DragCurrentAccumDirty = false;
  return false;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiDragFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool has_min_max = (v_min != v_max);
    const bool is_power = (power != 1.0f && is_decimal && has_min_max && (v_max - v_min < FLT_MAX));

    // Default tweak speed
    if (v_speed == 0.0f && has_min_max && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f*1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = has_min_max && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    bool is_drag_direction_change_with_power = is_power && ((adjust_delta < 0 && g.DragCurrentAccum > 0) || (adjust_delta > 0 && g.DragCurrentAccum < 0));
    if (is_just_activated || is_already_past_limits_and_pushing_outward || is_drag_direction_change_with_power)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    if (is_power)
    {
        // Offset + round to user desired precision, with a curve on the v_min..v_max range to get more precision on one side of the range
        FLOATTYPE v_old_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        FLOATTYPE v_new_norm_curved = v_old_norm_curved + (g.DragCurrentAccum / (v_max - v_min));
        v_cur = v_min + (TYPE)ImPow(ImSaturate((float)v_new_norm_curved), power) * (v_max - v_min);
        v_old_ref_for_accum_remainder = v_old_norm_curved;
    }
    else
    {
        v_cur += (TYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_power)
    {
        FLOATTYPE v_cur_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        g.DragCurrentAccum -= (float)(v_cur_norm_curved - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && has_min_max)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}